

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QString * __thiscall QTimeZone::abbreviation(QTimeZone *this,QDateTime *atDateTime)

{
  long lVar1;
  bool bVar2;
  TimeSpec TVar3;
  QTimeZonePrivate *pQVar4;
  qint64 qVar5;
  QTimeZone *in_RDX;
  ShortData *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qint32 in_stack_000000ec;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff10;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff18;
  QString *this_00;
  QDateTime *in_stack_ffffffffffffff58;
  QUtcTimeZonePrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = Data::isShort((Data *)in_RSI);
  if (bVar2) {
    TVar3 = ShortData::spec(in_RSI);
    if (TVar3 == LocalTime) {
      systemTimeZone();
      abbreviation(in_RDX,in_stack_ffffffffffffff58);
      ~QTimeZone((QTimeZone *)0x58079a);
      goto LAB_0058087a;
    }
    if (TVar3 - UTC < 2) {
      QUtcTimeZonePrivate::QUtcTimeZonePrivate(in_stack_ffffffffffffffd0,in_stack_000000ec);
      QDateTime::toMSecsSinceEpoch((QDateTime *)this_00);
      QUtcTimeZonePrivate::abbreviation(in_stack_ffffffffffffff18,(qint64)in_stack_ffffffffffffff10)
      ;
      QUtcTimeZonePrivate::~QUtcTimeZonePrivate(in_stack_ffffffffffffff10);
      goto LAB_0058087a;
    }
  }
  else {
    bVar2 = isValid((QTimeZone *)in_stack_ffffffffffffff18);
    if (bVar2) {
      pQVar4 = Data::operator->((Data *)in_RSI);
      qVar5 = QDateTime::toMSecsSinceEpoch((QDateTime *)this_00);
      (*pQVar4->_vptr_QTimeZonePrivate[7])(this_00,pQVar4,qVar5);
      goto LAB_0058087a;
    }
  }
  QString::QString((QString *)0x58087a);
LAB_0058087a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTimeZone::abbreviation(const QDateTime &atDateTime) const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().abbreviation(atDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            return QUtcTimeZonePrivate(d.s.offset).abbreviation(atDateTime.toMSecsSinceEpoch());
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (isValid()) {
        return d->abbreviation(atDateTime.toMSecsSinceEpoch());
    }

    return QString();
}